

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O2

void __thiscall
phmap::priv::
raw_hash_set<phmap::priv::NodeHashMapPolicy<int,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_int>_>_>
::raw_hash_set(raw_hash_set<phmap::priv::NodeHashMapPolicy<int,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_int>_>_>
               *this,raw_hash_set<phmap::priv::NodeHashMapPolicy<int,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_int>_>_>
                     *that,allocator_type *a)

{
  Alloc<std::pair<const_int,_int>_> AVar1;
  slot_type *pptVar2;
  size_t sVar3;
  unsigned_long uVar4;
  ctrl_t *pcVar5;
  iterator __begin0;
  iterator local_48;
  pair<phmap::priv::raw_hash_set<phmap::priv::NodeHashMapPolicy<int,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_int>_>_>::iterator,_bool>
  local_38;
  
  this->size_ = 0;
  this->capacity_ = 0;
  this->ctrl_ = (ctrl_t *)0x0;
  this->slots_ = (slot_type *)0x0;
  AVar1.id_ = a->id_;
  (this->settings_).
  super__Tuple_impl<0UL,_unsigned_long,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_int>_>_>
  .
  super__Tuple_impl<1UL,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_int>_>_>
  .
  super__Tuple_impl<2UL,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_int>_>_>
  .super__Tuple_impl<3UL,_phmap::priv::Alloc<std::pair<const_int,_int>_>_>.
  super__Head_base<3UL,_phmap::priv::Alloc<std::pair<const_int,_int>_>,_false>._M_head_impl.id_ =
       AVar1.id_;
  sVar3 = (that->settings_).
          super__Tuple_impl<0UL,_unsigned_long,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_int>_>_>
          .
          super__Tuple_impl<1UL,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_int>_>_>
          .super__Head_base<1UL,_phmap::priv::StatefulTestingHash,_false>._M_head_impl.
          super_WithId<phmap::priv::StatefulTestingHash>.id_;
  (this->settings_).
  super__Tuple_impl<0UL,_unsigned_long,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_int>_>_>
  .
  super__Tuple_impl<1UL,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_int>_>_>
  .
  super__Tuple_impl<2UL,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_int>_>_>
  .super__Head_base<2UL,_phmap::priv::StatefulTestingEqual,_false>._M_head_impl.
  super_WithId<phmap::priv::StatefulTestingEqual>.id_ =
       (that->settings_).
       super__Tuple_impl<0UL,_unsigned_long,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_int>_>_>
       .
       super__Tuple_impl<1UL,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_int>_>_>
       .
       super__Tuple_impl<2UL,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_int>_>_>
       .super__Head_base<2UL,_phmap::priv::StatefulTestingEqual,_false>._M_head_impl.
       super_WithId<phmap::priv::StatefulTestingEqual>.id_;
  (this->settings_).
  super__Tuple_impl<0UL,_unsigned_long,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_int>_>_>
  .
  super__Tuple_impl<1UL,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_int>_>_>
  .super__Head_base<1UL,_phmap::priv::StatefulTestingHash,_false>._M_head_impl.
  super_WithId<phmap::priv::StatefulTestingHash>.id_ = sVar3;
  (this->settings_).
  super__Tuple_impl<0UL,_unsigned_long,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_int>_>_>
  .super__Head_base<0UL,_unsigned_long,_false>._M_head_impl = 0;
  if (AVar1.id_ ==
      (that->settings_).
      super__Tuple_impl<0UL,_unsigned_long,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_int>_>_>
      .
      super__Tuple_impl<1UL,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_int>_>_>
      .
      super__Tuple_impl<2UL,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_int>_>_>
      .super__Tuple_impl<3UL,_phmap::priv::Alloc<std::pair<const_int,_int>_>_>.
      super__Head_base<3UL,_phmap::priv::Alloc<std::pair<const_int,_int>_>,_false>._M_head_impl.id_)
  {
    this->ctrl_ = that->ctrl_;
    that->ctrl_ = (ctrl_t *)0x0;
    pptVar2 = this->slots_;
    this->slots_ = that->slots_;
    that->slots_ = pptVar2;
    this->size_ = that->size_;
    that->size_ = 0;
    sVar3 = this->capacity_;
    this->capacity_ = that->capacity_;
    that->capacity_ = sVar3;
    uVar4 = (this->settings_).
            super__Tuple_impl<0UL,_unsigned_long,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_int>_>_>
            .super__Head_base<0UL,_unsigned_long,_false>._M_head_impl;
    (this->settings_).
    super__Tuple_impl<0UL,_unsigned_long,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_int>_>_>
    .super__Head_base<0UL,_unsigned_long,_false>._M_head_impl =
         (that->settings_).
         super__Tuple_impl<0UL,_unsigned_long,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_int>_>_>
         .super__Head_base<0UL,_unsigned_long,_false>._M_head_impl;
    (that->settings_).
    super__Tuple_impl<0UL,_unsigned_long,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_int>_>_>
    .super__Head_base<0UL,_unsigned_long,_false>._M_head_impl = uVar4;
  }
  else {
    reserve(this,that->size_);
    local_48 = begin(that);
    pcVar5 = that->ctrl_;
    sVar3 = that->capacity_;
    while (local_48.ctrl_ != pcVar5 + sVar3) {
      emplace<std::pair<const_int,_int>,_0>(&local_38,this,*local_48.field_1.slot_);
      iterator::operator++(&local_48);
    }
  }
  return;
}

Assistant:

raw_hash_set(raw_hash_set&& that, const allocator_type& a)
        : ctrl_(EmptyGroup<std_alloc_t>()),
          slots_(nullptr),
          size_(0),
          capacity_(0),
          settings_(0, that.hash_ref(), that.eq_ref(), a) {
        if (a == that.alloc_ref()) {
            std::swap(ctrl_, that.ctrl_);
            std::swap(slots_, that.slots_);
            std::swap(size_, that.size_);
            std::swap(capacity_, that.capacity_);
            std::swap(growth_left(), that.growth_left());
            std::swap(infoz_, that.infoz_);
        } else {
            reserve(that.size());
            // Note: this will copy elements of dense_set and unordered_set instead of
            // moving them. This can be fixed if it ever becomes an issue.
            for (auto& elem : that) insert(std::move(elem));
        }
    }